

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O3

void __thiscall
hiberlite::AVisitor<hiberlite::LoadBean>::popScope(AVisitor<hiberlite::LoadBean> *this)

{
  _Map_pointer ppSVar1;
  Scope *pSVar2;
  runtime_error *this_00;
  Scope *pSVar3;
  
  ppSVar1 = (this->stack).c.super__Deque_base<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  pSVar3 = (this->stack).c.super__Deque_base<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  pSVar2 = (this->stack).c.super__Deque_base<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_first;
  if (((long)pSVar3 - (long)pSVar2 >> 3) * -0x71c71c71c71c71c7 +
      (((long)ppSVar1 -
        (long)(this->stack).c.super__Deque_base<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
      (ulong)(ppSVar1 == (_Map_pointer)0x0)) * 7 !=
      ((long)(this->stack).c.super__Deque_base<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->stack).c.super__Deque_base<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * 0x71c71c71c71c71c7) {
    if (pSVar3 == pSVar2) {
      pSVar3 = ppSVar1[-1] + 7;
    }
    std::__cxx11::string::_M_assign((string *)&this->scope);
    std::__cxx11::string::_M_assign((string *)&(this->scope)._prefix);
    (this->scope).prefix_depth = pSVar3[-1].prefix_depth;
    std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>::pop_back(&(this->stack).c);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"popScope with empty stack");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AVisitor<C>::popScope()
{
	if(!stack.size())
		throw std::runtime_error("popScope with empty stack");
	scope=stack.top();
	stack.pop();
}